

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# div.h
# Opt level: O0

Context __thiscall
mp::
DivConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::Convert(DivConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,ItemType_conflict5 *dc,int param_3)

{
  bool bVar1;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *__n;
  FunctionalConstraint *in_RSI;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  ItemType_conflict5 *in_stack_00000238;
  DivConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_00000240;
  ItemType_conflict5 *in_stack_00000a28;
  DivConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_00000a30;
  undefined8 in_stack_ffffffffffffffc8;
  int var;
  Context local_4;
  
  var = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  FunctionalConstraint::GetResultVar(in_RSI);
  bVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::is_fixed(in_RDI,var);
  if (bVar1) {
    ConvertWithConstResult(in_stack_00000240,in_stack_00000238);
  }
  else {
    __n = BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                   *)in_RDI);
    CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::DivId>::GetArguments
              ((CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::DivId> *)
               (in_RSI + 1));
    std::array<int,_2UL>::operator[]((array<int,_2UL> *)in_RDI,(size_type)__n);
    bVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::is_fixed(in_RDI,(int)((ulong)__n >> 0x20));
    if (bVar1) {
      ConvertWithConstDivisor(in_stack_00000240,in_stack_00000238);
    }
    else {
      ConvertWithNonConstDivisor(in_stack_00000a30,in_stack_00000a28);
    }
  }
  Context::Context(&local_4,CTX_MIX);
  return (Context)local_4.value_;
}

Assistant:

Context Convert(const ItemType& dc, int ) {
    if (GetMC().is_fixed(dc.GetResultVar()))
      ConvertWithConstResult(dc);
    else if (GetMC().is_fixed(dc.GetArguments()[1]))
      ConvertWithConstDivisor(dc);
    else
      ConvertWithNonConstDivisor(dc);
    return Context::CTX_MIX;
  }